

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O3

Curl_addrinfo * Curl_unix2addr(char *path,_Bool *longpath,_Bool abstract)

{
  Curl_addrinfo *pCVar1;
  sockaddr *psVar2;
  size_t sVar3;
  ulong __n;
  char *__dest;
  
  *longpath = false;
  pCVar1 = (Curl_addrinfo *)(*Curl_ccalloc)(1,0x30);
  if (pCVar1 != (Curl_addrinfo *)0x0) {
    psVar2 = (sockaddr *)(*Curl_ccalloc)(1,0x6e);
    pCVar1->ai_addr = psVar2;
    if (psVar2 == (sockaddr *)0x0) {
      (*Curl_cfree)(pCVar1);
    }
    else {
      psVar2->sa_family = 1;
      sVar3 = strlen(path);
      __n = sVar3 + 1;
      if (__n < 0x6d) {
        pCVar1->ai_family = 1;
        pCVar1->ai_socktype = 1;
        pCVar1->ai_addrlen = (int)sVar3 + 3;
        if (abstract) {
          __dest = psVar2->sa_data + 1;
          __n = sVar3;
        }
        else {
          __dest = psVar2->sa_data;
        }
        memcpy(__dest,path,__n);
        return pCVar1;
      }
      (*Curl_cfree)(psVar2);
      (*Curl_cfree)(pCVar1);
      *longpath = true;
    }
  }
  return (Curl_addrinfo *)0x0;
}

Assistant:

Curl_addrinfo *Curl_unix2addr(const char *path, bool *longpath, bool abstract)
{
  Curl_addrinfo *ai;
  struct sockaddr_un *sa_un;
  size_t path_len;

  *longpath = FALSE;

  ai = calloc(1, sizeof(Curl_addrinfo));
  if(!ai)
    return NULL;
  ai->ai_addr = calloc(1, sizeof(struct sockaddr_un));
  if(!ai->ai_addr) {
    free(ai);
    return NULL;
  }

  sa_un = (void *) ai->ai_addr;
  sa_un->sun_family = AF_UNIX;

  /* sun_path must be able to store the NUL-terminated path */
  path_len = strlen(path) + 1;
  if(path_len > sizeof(sa_un->sun_path)) {
    free(ai->ai_addr);
    free(ai);
    *longpath = TRUE;
    return NULL;
  }

  ai->ai_family = AF_UNIX;
  ai->ai_socktype = SOCK_STREAM; /* assume reliable transport for HTTP */
  ai->ai_addrlen = (curl_socklen_t)
    ((offsetof(struct sockaddr_un, sun_path) + path_len) & 0x7FFFFFFF);

  /* Abstract Unix domain socket have NULL prefix instead of suffix */
  if(abstract)
    memcpy(sa_un->sun_path + 1, path, path_len - 1);
  else
    memcpy(sa_un->sun_path, path, path_len); /* copy NUL byte */

  return ai;
}